

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NamedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedStructurePatternMemberSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PatternSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,PatternSyntax *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  NamedStructurePatternMemberSyntax *pNVar11;
  
  pNVar11 = (NamedStructurePatternMemberSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedStructurePatternMemberSyntax *)this->endPtr < pNVar11 + 1) {
    pNVar11 = (NamedStructurePatternMemberSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pNVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pNVar11->super_StructurePatternMemberSyntax).super_SyntaxNode.kind = NamedStructurePatternMember;
  (pNVar11->super_StructurePatternMemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar11->super_StructurePatternMemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pNVar11->name).kind = TVar3;
  (pNVar11->name).field_0x2 = uVar4;
  (pNVar11->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pNVar11->name).rawLen = uVar6;
  (pNVar11->name).info = pIVar1;
  (pNVar11->colon).kind = TVar7;
  (pNVar11->colon).field_0x2 = uVar8;
  (pNVar11->colon).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar11->colon).rawLen = uVar10;
  (pNVar11->colon).info = pIVar2;
  (pNVar11->pattern).ptr = args_2;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pNVar11;
  return pNVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }